

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sk_gen.c
# Opt level: O3

int genpoly_gen(gf *out,gf *f)

{
  gf gVar1;
  gf gVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  gf *pgVar7;
  long lVar8;
  undefined8 *puVar9;
  ulong uVar10;
  long lVar11;
  gf *pgVar12;
  gf mat [65] [64];
  undefined8 *local_20e8;
  gf *local_20e0;
  gf local_20b8;
  undefined8 local_20b6;
  undefined8 uStack_20ae;
  undefined8 local_20a6;
  undefined8 uStack_209e;
  undefined8 local_2096;
  undefined8 uStack_208e;
  undefined8 local_2086;
  undefined8 uStack_207e;
  undefined8 local_2076;
  undefined8 uStack_206e;
  undefined8 local_2066;
  undefined8 uStack_205e;
  undefined8 local_2056;
  undefined6 uStack_204e;
  undefined2 uStack_2048;
  undefined6 uStack_2046;
  undefined8 uStack_2040;
  undefined1 local_2038 [128];
  gf local_1fb8 [3968];
  undefined1 local_b8 [136];
  
  local_20b8 = 1;
  local_20b6 = 0;
  uStack_20ae = 0;
  local_20a6 = 0;
  uStack_209e = 0;
  local_2096 = 0;
  uStack_208e = 0;
  local_2086 = 0;
  uStack_207e = 0;
  local_2076 = 0;
  uStack_206e = 0;
  local_2066 = 0;
  uStack_205e = 0;
  local_2056 = 0;
  uStack_204e = 0;
  uStack_2048 = 0;
  uStack_2046 = 0;
  uStack_2040 = 0;
  memcpy(local_2038,f,0x80);
  lVar6 = 0x3f;
  pgVar12 = local_1fb8;
  do {
    GF_mul(pgVar12,pgVar12 + -0x40,f);
    pgVar12 = pgVar12 + 0x40;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  lVar11 = 1;
  pgVar12 = &local_20b8;
  lVar6 = 0x2080;
  local_20e8 = &local_20b6;
  uVar3 = 0;
  local_20e0 = pgVar12;
  while( true ) {
    if (uVar3 < 0x3f) {
      lVar8 = lVar11;
      puVar9 = local_20e8;
      do {
        gVar1 = gf_iszero((&local_20b8)[uVar3 * 0x41]);
        lVar4 = 0;
        do {
          *(ushort *)((long)pgVar12 + lVar4) =
               *(ushort *)((long)pgVar12 + lVar4) ^ *(ushort *)((long)puVar9 + lVar4) & gVar1;
          lVar4 = lVar4 + 0x80;
        } while (lVar6 != lVar4);
        lVar8 = lVar8 + 1;
        puVar9 = (undefined8 *)((long)puVar9 + 2);
      } while (lVar8 != 0x40);
    }
    if ((&local_20b8)[uVar3 * 0x41] == 0) break;
    uVar5 = uVar3 + 1;
    gVar1 = gf_inv((&local_20b8)[uVar3 * 0x41]);
    lVar8 = 0;
    do {
      gVar2 = gf_mul(*(gf *)((long)pgVar12 + lVar8),gVar1);
      *(gf *)((long)pgVar12 + lVar8) = gVar2;
      lVar8 = lVar8 + 0x80;
    } while (lVar6 != lVar8);
    uVar10 = 0;
    pgVar7 = local_20e0;
    do {
      if (uVar10 != uVar3) {
        gVar1 = (&local_20b8)[uVar3 * 0x40 + uVar10];
        lVar8 = 0;
        do {
          gVar2 = gf_mul(*(gf *)((long)pgVar12 + lVar8),gVar1);
          *(ushort *)((long)pgVar7 + lVar8) = *(ushort *)((long)pgVar7 + lVar8) ^ gVar2;
          lVar8 = lVar8 + 0x80;
        } while (lVar6 != lVar8);
      }
      uVar10 = uVar10 + 1;
      pgVar7 = pgVar7 + 1;
    } while (uVar10 != 0x40);
    lVar11 = lVar11 + 1;
    local_20e8 = (undefined8 *)((long)local_20e8 + 0x82);
    pgVar12 = pgVar12 + 0x41;
    lVar6 = lVar6 + -0x80;
    local_20e0 = local_20e0 + 0x40;
    uVar3 = uVar5;
    if (uVar5 == 0x40) {
      memcpy(out,local_b8,0x80);
      return 0;
    }
  }
  return -1;
}

Assistant:

int genpoly_gen(gf *out, gf *f)
{
	int i, j, k, c;

	gf mat[ SYS_T+1 ][ SYS_T ];
	gf mask, inv, t;

	// fill matrix

	mat[0][0] = 1;

	for (i = 1; i < SYS_T; i++)
		mat[0][i] = 0;

	for (i = 0; i < SYS_T; i++)
		mat[1][i] = f[i];

	for (j = 2; j <= SYS_T; j++)
		GF_mul(mat[j], mat[j-1], f);

	// gaussian

	for (j = 0; j < SYS_T; j++)
	{
		for (k = j + 1; k < SYS_T; k++)
		{
			mask = gf_iszero(mat[ j ][ j ]);

			for (c = j; c < SYS_T + 1; c++)
				mat[ c ][ j ] ^= mat[ c ][ k ] & mask;

		}

		if ( mat[ j ][ j ] == 0 ) // return if not systematic
		{
			return -1;
		}

		inv = gf_inv(mat[j][j]);

		for (c = j; c < SYS_T + 1; c++)
			mat[ c ][ j ] = gf_mul(mat[ c ][ j ], inv) ;

		for (k = 0; k < SYS_T; k++)
		{
			if (k != j)
			{
				t = mat[ j ][ k ];

				for (c = j; c < SYS_T + 1; c++)
					mat[ c ][ k ] ^= gf_mul(mat[ c ][ j ], t);
			}
		}
	}

	for (i = 0; i < SYS_T; i++)
		out[i] = mat[ SYS_T ][ i ];

	return 0;
}